

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

atf_error_t microatf_tp_add_tcs(atf_tp_t *tp)

{
  ulong uVar1;
  atf_error_t ec_42;
  atf_error_t ec_41;
  atf_error_t ec_40;
  atf_error_t ec_39;
  atf_error_t ec_38;
  atf_error_t ec_37;
  atf_error_t ec_36;
  atf_error_t ec_35;
  atf_error_t ec_34;
  atf_error_t ec_33;
  atf_error_t ec_32;
  atf_error_t ec_31;
  atf_error_t ec_30;
  atf_error_t ec_29;
  atf_error_t ec_28;
  atf_error_t ec_27;
  atf_error_t ec_26;
  atf_error_t ec_25;
  atf_error_t ec_24;
  atf_error_t ec_23;
  atf_error_t ec_22;
  atf_error_t ec_21;
  atf_error_t ec_20;
  atf_error_t ec_19;
  atf_error_t ec_18;
  atf_error_t ec_17;
  atf_error_t ec_16;
  atf_error_t ec_15;
  atf_error_t ec_14;
  atf_error_t ec_13;
  atf_error_t ec_12;
  atf_error_t ec_11;
  atf_error_t ec_10;
  atf_error_t ec_9;
  atf_error_t ec_8;
  atf_error_t ec_7;
  atf_error_t ec_6;
  atf_error_t ec_5;
  atf_error_t ec_4;
  atf_error_t ec_3;
  atf_error_t ec_2;
  atf_error_t ec_1;
  atf_error_t ec;
  atf_tp_t *tp_local;
  
  tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_epoll__simple);
  uVar1 = atf_is_error(tp_local);
  if ((uVar1 & 1) == 0) {
    tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_epoll__leakcheck);
    uVar1 = atf_is_error(tp_local);
    if ((uVar1 & 1) == 0) {
      tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_epoll__fd_exhaustion);
      uVar1 = atf_is_error(tp_local);
      if ((uVar1 & 1) == 0) {
        tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_epoll__invalid_op);
        uVar1 = atf_is_error(tp_local);
        if ((uVar1 & 1) == 0) {
          tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_epoll__invalid_op2);
          uVar1 = atf_is_error(tp_local);
          if ((uVar1 & 1) == 0) {
            tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_epoll__rdhup_linux);
            uVar1 = atf_is_error(tp_local);
            if ((uVar1 & 1) == 0) {
              tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_epoll__simple_wait);
              uVar1 = atf_is_error(tp_local);
              if ((uVar1 & 1) == 0) {
                tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_epoll__event_size);
                uVar1 = atf_is_error(tp_local);
                if ((uVar1 & 1) == 0) {
                  tp_local = (atf_tp_t *)
                             microatf_tp_add_tc(tp,&microatf_tc_epoll__recursive_register);
                  uVar1 = atf_is_error(tp_local);
                  if ((uVar1 & 1) == 0) {
                    tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_epoll__simple_epollin)
                    ;
                    uVar1 = atf_is_error(tp_local);
                    if ((uVar1 & 1) == 0) {
                      tp_local = (atf_tp_t *)
                                 microatf_tp_add_tc(tp,&microatf_tc_epoll__sleep_argument);
                      uVar1 = atf_is_error(tp_local);
                      if ((uVar1 & 1) == 0) {
                        tp_local = (atf_tp_t *)
                                   microatf_tp_add_tc(tp,&microatf_tc_epoll__remove_nonexistent);
                        uVar1 = atf_is_error(tp_local);
                        if ((uVar1 & 1) == 0) {
                          tp_local = (atf_tp_t *)
                                     microatf_tp_add_tc(tp,&microatf_tc_epoll__add_remove);
                          uVar1 = atf_is_error(tp_local);
                          if ((uVar1 & 1) == 0) {
                            tp_local = (atf_tp_t *)
                                       microatf_tp_add_tc(tp,&microatf_tc_epoll__add_existing);
                            uVar1 = atf_is_error(tp_local);
                            if ((uVar1 & 1) == 0) {
                              tp_local = (atf_tp_t *)
                                         microatf_tp_add_tc(tp,&microatf_tc_epoll__modify_existing);
                              uVar1 = atf_is_error(tp_local);
                              if ((uVar1 & 1) == 0) {
                                tp_local = (atf_tp_t *)
                                           microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__modify_nonexisting);
                                uVar1 = atf_is_error(tp_local);
                                if ((uVar1 & 1) == 0) {
                                  tp_local = (atf_tp_t *)
                                             microatf_tp_add_tc(tp,&microatf_tc_epoll__poll_only_fd)
                                  ;
                                  uVar1 = atf_is_error(tp_local);
                                  if ((uVar1 & 1) == 0) {
                                    tp_local = (atf_tp_t *)
                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__no_epollin_on_closed_empty_pipe
                                                  );
                                    uVar1 = atf_is_error(tp_local);
                                    if ((uVar1 & 1) == 0) {
                                      tp_local = (atf_tp_t *)
                                                 microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__write_to_pipe_until_full);
                                      uVar1 = atf_is_error(tp_local);
                                      if ((uVar1 & 1) == 0) {
                                        tp_local = (atf_tp_t *)
                                                   microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__realtime_timer);
                                        uVar1 = atf_is_error(tp_local);
                                        if ((uVar1 & 1) == 0) {
                                          tp_local = (atf_tp_t *)
                                                     microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__simple_signalfd);
                                          uVar1 = atf_is_error(tp_local);
                                          if ((uVar1 & 1) == 0) {
                                            tp_local = (atf_tp_t *)
                                                       microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__signalfd_poll_sigusr1);
                                            uVar1 = atf_is_error(tp_local);
                                            if ((uVar1 & 1) == 0) {
                                              tp_local = (atf_tp_t *)
                                                         microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__signalfd_in_thread);
                                              uVar1 = atf_is_error(tp_local);
                                              if ((uVar1 & 1) == 0) {
                                                tp_local = (atf_tp_t *)
                                                           microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__socket_shutdown);
                                                uVar1 = atf_is_error(tp_local);
                                                if ((uVar1 & 1) == 0) {
                                                  tp_local = (atf_tp_t *)
                                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollhup_on_fresh_socket);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollout_on_connecting_socket);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollpri);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollpri_oobinline);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollpri_oobinline_lt);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__timeout_on_listening_socket);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollerr_on_closed_pipe);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__shutdown_behavior);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__datagram_connection);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epollout_on_own_shutdown);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__remove_closed);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__remove_closed_when_same_fd_open
                                                  );
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__add_different_file_with_same_fd_value
                                                  );
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__invalid_writes);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__using_real_close);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__epoll_pwait);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__cloexec);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__fcntl_fl);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)
                                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_epoll__fcntl_issue49);
                                                  uVar1 = atf_is_error(tp_local);
                                                  if ((uVar1 & 1) == 0) {
                                                    tp_local = (atf_tp_t *)atf_no_error();
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (atf_error_t)tp_local;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, epoll__simple);
#ifndef USE_EPOLLRDHUP_LINUX_DEFINITION
	ATF_TP_ADD_TC(tp, epoll__poll_flags);
#endif
	ATF_TP_ADD_TC(tp, epoll__leakcheck);
	ATF_TP_ADD_TC(tp, epoll__fd_exhaustion);
	ATF_TP_ADD_TC(tp, epoll__invalid_op);
	ATF_TP_ADD_TC(tp, epoll__invalid_op2);
	ATF_TP_ADD_TC(tp, epoll__rdhup_linux);
	ATF_TP_ADD_TC(tp, epoll__simple_wait);
	ATF_TP_ADD_TC(tp, epoll__event_size);
	ATF_TP_ADD_TC(tp, epoll__recursive_register);
	ATF_TP_ADD_TC(tp, epoll__simple_epollin);
	ATF_TP_ADD_TC(tp, epoll__sleep_argument);
	ATF_TP_ADD_TC(tp, epoll__remove_nonexistent);
	ATF_TP_ADD_TC(tp, epoll__add_remove);
	ATF_TP_ADD_TC(tp, epoll__add_existing);
	ATF_TP_ADD_TC(tp, epoll__modify_existing);
	ATF_TP_ADD_TC(tp, epoll__modify_nonexisting);
	ATF_TP_ADD_TC(tp, epoll__poll_only_fd);
	ATF_TP_ADD_TC(tp, epoll__no_epollin_on_closed_empty_pipe);
	ATF_TP_ADD_TC(tp, epoll__write_to_pipe_until_full);
	ATF_TP_ADD_TC(tp, epoll__realtime_timer);
	ATF_TP_ADD_TC(tp, epoll__simple_signalfd);
	ATF_TP_ADD_TC(tp, epoll__signalfd_poll_sigusr1);
	ATF_TP_ADD_TC(tp, epoll__signalfd_in_thread);
	ATF_TP_ADD_TC(tp, epoll__socket_shutdown);
	ATF_TP_ADD_TC(tp, epoll__epollhup_on_fresh_socket);
	ATF_TP_ADD_TC(tp, epoll__epollout_on_connecting_socket);
	ATF_TP_ADD_TC(tp, epoll__epollpri);
	ATF_TP_ADD_TC(tp, epoll__epollpri_oobinline);
	ATF_TP_ADD_TC(tp, epoll__epollpri_oobinline_lt);
	ATF_TP_ADD_TC(tp, epoll__timeout_on_listening_socket);
	ATF_TP_ADD_TC(tp, epoll__epollerr_on_closed_pipe);
	ATF_TP_ADD_TC(tp, epoll__shutdown_behavior);
	ATF_TP_ADD_TC(tp, epoll__datagram_connection);
	ATF_TP_ADD_TC(tp, epoll__epollout_on_own_shutdown);
	ATF_TP_ADD_TC(tp, epoll__remove_closed);
	ATF_TP_ADD_TC(tp, epoll__remove_closed_when_same_fd_open);
	ATF_TP_ADD_TC(tp, epoll__add_different_file_with_same_fd_value);
	ATF_TP_ADD_TC(tp, epoll__invalid_writes);
	ATF_TP_ADD_TC(tp, epoll__using_real_close);
	ATF_TP_ADD_TC(tp, epoll__epoll_pwait);
	ATF_TP_ADD_TC(tp, epoll__cloexec);
	ATF_TP_ADD_TC(tp, epoll__fcntl_fl);
	ATF_TP_ADD_TC(tp, epoll__fcntl_issue49);

	return atf_no_error();
}